

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

InputMap * Omega_h::read_input(InputMap *__return_storage_ptr__,path *path)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  ScopedTimer omega_h_scoped_function_timer;
  string __str;
  ScopedTimer local_a9;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_48);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_58 = *puVar4;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *puVar4;
    local_68 = (ulong *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_88 = local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,3,0x39c);
  uVar5 = 0xf;
  if (local_68 != &local_58) {
    uVar5 = local_58;
  }
  if (uVar5 < (ulong)(local_80 + local_60)) {
    uVar5 = 0xf;
    if (local_88 != local_78) {
      uVar5 = local_78[0];
    }
    if ((ulong)(local_80 + local_60) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
      goto LAB_002ec573;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
LAB_002ec573:
  local_a8 = &local_98;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_98 = *plVar2;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *plVar2;
    local_a8 = (long *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  begin_code("read_input",(char *)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  read_input_without_includes(__return_storage_ptr__,path);
  do {
    bVar1 = handle_one_include(__return_storage_ptr__);
  } while (bVar1);
  ScopedTimer::~ScopedTimer(&local_a9);
  return __return_storage_ptr__;
}

Assistant:

InputMap read_input(Omega_h::filesystem::path const& path) {
  OMEGA_H_TIME_FUNCTION;
  InputMap map = read_input_without_includes(path);
  while (handle_one_include(map))
    ;
  return map;
}